

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFromIntoUninitializedExtension
          (ExtensionSet *this,Extension *dst_extension,MessageLite *extendee,int number,
          Extension *other_extension,Arena *other_arena)

{
  bool bVar1;
  MessageLite *this_00;
  FieldType FVar2;
  undefined1 uVar3;
  bool bVar4;
  TrivialAtomicInt TVar5;
  CppType CVar6;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar7;
  undefined4 extraout_var;
  
  dst_extension->descriptor = other_extension->descriptor;
  FVar2 = other_extension->type;
  bVar1 = other_extension->is_repeated;
  uVar3 = other_extension->field_0xa;
  bVar4 = other_extension->is_packed;
  TVar5.int_ = (other_extension->cached_size).int_[0];
  dst_extension->field_0 = other_extension->field_0;
  dst_extension->type = FVar2;
  dst_extension->is_repeated = bVar1;
  dst_extension->field_0xa = uVar3;
  dst_extension->is_packed = bVar4;
  dst_extension->cached_size = (TrivialAtomicInt)TVar5.int_;
  bVar1 = other_extension->is_repeated;
  CVar6 = anon_unknown_59::cpp_type(other_extension->type);
  if (bVar1 == true) {
    switch(CVar6) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<int>::MergeFrom
                ((RepeatedField<int> *)aVar7,(RepeatedField<int> *)other_extension->field_0);
      return;
    case CPPTYPE_INT64:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<long>::MergeFrom
                ((RepeatedField<long> *)aVar7,(RepeatedField<long> *)other_extension->field_0);
      return;
    case CPPTYPE_UINT32:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_int>>
                        (this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<unsigned_int>::MergeFrom
                ((RepeatedField<unsigned_int> *)aVar7,
                 (RepeatedField<unsigned_int> *)other_extension->field_0);
      return;
    case CPPTYPE_UINT64:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>
                        (this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<unsigned_long>::MergeFrom
                ((RepeatedField<unsigned_long> *)aVar7,
                 (RepeatedField<unsigned_long> *)other_extension->field_0);
      return;
    case CPPTYPE_DOUBLE:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<double>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<double>::MergeFrom
                ((RepeatedField<double> *)aVar7,(RepeatedField<double> *)other_extension->field_0);
      return;
    case CPPTYPE_FLOAT:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<float>::MergeFrom
                ((RepeatedField<float> *)aVar7,(RepeatedField<float> *)other_extension->field_0);
      return;
    case CPPTYPE_BOOL:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<bool>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<bool>::MergeFrom
                ((RepeatedField<bool> *)aVar7,(RepeatedField<bool> *)other_extension->field_0);
      return;
    case CPPTYPE_STRING:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        (this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)aVar7,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)other_extension->field_0);
      return;
    case CPPTYPE_MESSAGE:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::
              CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedPtrField<google::protobuf::MessageLite>::MergeFrom
                ((RepeatedPtrField<google::protobuf::MessageLite> *)aVar7,
                 (RepeatedPtrField<google::protobuf::MessageLite> *)other_extension->field_0);
      return;
    }
  }
  else {
    if (CVar6 == CPPTYPE_MESSAGE) {
      this_00 = (MessageLite *)(other_extension->field_0).int64_t_value;
      if ((other_extension->field_0xa & 4) == 0) {
        aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)MessageLite::New(this_00,this->arena_);
        dst_extension->field_0 = aVar7;
        MessageLite::CheckTypeAndMergeFrom
                  ((MessageLite *)aVar7,(MessageLite *)other_extension->field_0);
        return;
      }
      aVar7._0_4_ = (*this_00->_vptr_MessageLite[2])(this_00,this->arena_,this_00,other_arena);
      aVar7.int64_t_value._4_4_ = extraout_var;
    }
    else {
      if (CVar6 != CPPTYPE_STRING) {
        return;
      }
      aVar7.int64_t_value =
           (int64_t)Arena::Create<std::__cxx11::string,std::__cxx11::string&>
                              (this->arena_,other_extension->field_0);
    }
    dst_extension->field_0 = aVar7;
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFromIntoUninitializedExtension(
    Extension& dst_extension, const MessageLite* extendee, int number,
    const Extension& other_extension, Arena* other_arena) {
  // Copy and initialize all the fields.
  // We fix up incorrect pointers later.
  // Primitive values are copied here.
  dst_extension = other_extension;

  if (other_extension.is_repeated) {
    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)       \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
    dst_extension.ptr.repeated_##LOWERCASE##_value =           \
        Arena::Create<REPEATED_TYPE>(arena_);                  \
    dst_extension.ptr.repeated_##LOWERCASE##_value->MergeFrom( \
        *other_extension.ptr.repeated_##LOWERCASE##_value);    \
    break;

      HANDLE_TYPE(INT32, int32_t, RepeatedField<int32_t>);
      HANDLE_TYPE(INT64, int64_t, RepeatedField<int64_t>);
      HANDLE_TYPE(UINT32, uint32_t, RepeatedField<uint32_t>);
      HANDLE_TYPE(UINT64, uint64_t, RepeatedField<uint64_t>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
      HANDLE_TYPE(MESSAGE, message, RepeatedPtrField<MessageLite>);
#undef HANDLE_TYPE
    }
    return;
  }

  // Non-repeated extension
  switch (cpp_type(other_extension.type)) {
    case WireFormatLite::CPPTYPE_INT32:
    case WireFormatLite::CPPTYPE_INT64:
    case WireFormatLite::CPPTYPE_UINT32:
    case WireFormatLite::CPPTYPE_UINT64:
    case WireFormatLite::CPPTYPE_FLOAT:
    case WireFormatLite::CPPTYPE_DOUBLE:
    case WireFormatLite::CPPTYPE_BOOL:
    case WireFormatLite::CPPTYPE_ENUM:
      break;  // Do nothing.
    case WireFormatLite::CPPTYPE_STRING:
      dst_extension.ptr.string_value =
          Arena::Create<std::string>(arena_, *other_extension.ptr.string_value);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE: {
      if (other_extension.is_lazy) {
        dst_extension.ptr.lazymessage_value =
            other_extension.ptr.lazymessage_value->Clone(
                arena_, *other_extension.ptr.lazymessage_value, other_arena);
      } else {
        dst_extension.ptr.message_value =
            other_extension.ptr.message_value->New(arena_);
        dst_extension.ptr.message_value->CheckTypeAndMergeFrom(
            *other_extension.ptr.message_value);
      }
      break;
    }
  }
}